

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O1

void push_layout(mu_Context *ctx,mu_Rect body,mu_Vec2 scroll)

{
  int *piVar1;
  mu_Layout *pmVar2;
  mu_Rect *pmVar3;
  int iVar4;
  int iVar5;
  mu_Style *pmVar6;
  long lVar7;
  mu_Vec2 mVar8;
  mu_Vec2 *pmVar9;
  int *piVar10;
  int iVar11;
  mu_Vec2 mVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  
  lVar7 = (long)(ctx->layout_stack).idx;
  if (lVar7 < 0x10) {
    uVar14 = (ulong)(uint)(body.x - scroll.x) |
             body._0_8_ - ((ulong)scroll & 0xffffffff00000000) & 0xffffffff00000000;
    pmVar2 = (ctx->layout_stack).items + lVar7;
    (pmVar2->body).x = (int)uVar14;
    (pmVar2->body).y = (int)(uVar14 >> 0x20);
    pmVar2 = (ctx->layout_stack).items + lVar7;
    (pmVar2->body).w = (int)body._8_8_;
    (pmVar2->body).h = (int)((ulong)body._8_8_ >> 0x20);
    pmVar3 = &(ctx->layout_stack).items[lVar7].next;
    pmVar3->x = 0;
    pmVar3->y = 0;
    pmVar3->w = 0;
    pmVar3->h = 0;
    pmVar9 = &(ctx->layout_stack).items[lVar7].position;
    pmVar9->x = 0;
    pmVar9->y = 0;
    pmVar9[1].x = 0;
    pmVar9[1].y = 0;
    pmVar2 = (ctx->layout_stack).items + lVar7;
    (pmVar2->max).x = -0x1000000;
    (pmVar2->max).y = -0x1000000;
    piVar10 = (ctx->layout_stack).items[lVar7].widths;
    piVar10[0] = 0;
    piVar10[1] = 0;
    piVar10[2] = 0;
    piVar10[3] = 0;
    piVar10 = (ctx->layout_stack).items[lVar7].widths;
    piVar10[4] = 0;
    piVar10[5] = 0;
    piVar10[6] = 0;
    piVar10[7] = 0;
    piVar10 = (ctx->layout_stack).items[lVar7].widths;
    piVar10[8] = 0;
    piVar10[9] = 0;
    piVar10[10] = 0;
    piVar10[0xb] = 0;
    piVar10 = (ctx->layout_stack).items[lVar7].widths;
    piVar10[0xc] = 0;
    piVar10[0xd] = 0;
    piVar10[0xe] = 0;
    piVar10[0xf] = 0;
    pmVar2 = (ctx->layout_stack).items + lVar7;
    pmVar2->items = 0;
    pmVar2->item_index = 0;
    *(undefined8 *)(&pmVar2->items + 2) = 0;
    (ctx->layout_stack).items[lVar7].indent = 0;
    iVar4 = (ctx->layout_stack).idx;
    (ctx->layout_stack).idx = iVar4 + 1;
    (ctx->layout_stack).items[iVar4].widths[0] = 0;
    pmVar2 = (ctx->layout_stack).items + iVar4;
    pmVar2->items = 1;
    pmVar2->item_index = 0;
    mVar12.y = (ctx->layout_stack).items[iVar4].next_row;
    mVar12.x = (ctx->layout_stack).items[iVar4].indent;
    (ctx->layout_stack).items[iVar4].position = mVar12;
    (ctx->layout_stack).items[iVar4].size.y = 0;
    return;
  }
  push_layout_cold_1();
  iVar4 = (ctx->layout_stack).idx;
  piVar10 = (int *)((long)&ctx->id_stack + (long)iVar4 * 0x8c + -4);
  pmVar6 = ctx->style;
  iVar13 = (ctx->layout_stack).items[(long)iVar4 + -1].next_type;
  if (iVar13 == 0) {
    if ((ctx->layout_stack).items[(long)iVar4 + -1].item_index ==
        (ctx->layout_stack).items[(long)iVar4 + -1].items) {
      mVar8.y = (ctx->layout_stack).items[(long)iVar4 + -1].next_row;
      mVar8.x = (ctx->layout_stack).items[(long)iVar4 + -1].indent;
      (ctx->layout_stack).items[(long)iVar4 + -1].position = mVar8;
      (ctx->layout_stack).items[(long)iVar4 + -1].item_index = 0;
    }
    if ((ctx->layout_stack).items[(long)iVar4 + -1].items < 1) {
      pmVar9 = &(ctx->layout_stack).items[(long)iVar4 + -1].size;
    }
    else {
      pmVar9 = (mu_Vec2 *)
               (piVar10 + (long)(ctx->layout_stack).items[(long)iVar4 + -1].item_index + 0xe);
    }
    iVar15 = pmVar9->x;
    iVar16 = (ctx->layout_stack).items[(long)iVar4 + -1].size.y;
    if (iVar15 == 0) {
      iVar15 = pmVar6->padding * 2 + (pmVar6->size).x;
    }
    if (iVar16 == 0) {
      iVar16 = pmVar6->padding * 2 + (pmVar6->size).y;
    }
    iVar17 = (ctx->layout_stack).items[(long)iVar4 + -1].position.x;
    if (iVar15 < 0) {
      iVar15 = (iVar15 - iVar17) + *(int *)((long)&ctx->id_stack + (long)iVar4 * 0x8c + 4) + 1;
    }
    iVar18 = (ctx->layout_stack).items[(long)iVar4 + -1].position.y;
    if (iVar16 < 0) {
      iVar16 = (iVar16 - iVar18) + (ctx->layout_stack).items[(long)iVar4 + -1].body.h + 1;
    }
    piVar1 = &(ctx->layout_stack).items[(long)iVar4 + -1].item_index;
    *piVar1 = *piVar1 + 1;
  }
  else {
    (ctx->layout_stack).items[(long)iVar4 + -1].next_type = 0;
    iVar17 = (ctx->layout_stack).items[(long)iVar4 + -1].next.x;
    iVar18 = (ctx->layout_stack).items[(long)iVar4 + -1].next.y;
    iVar15 = (ctx->layout_stack).items[(long)iVar4 + -1].next.w;
    iVar16 = (ctx->layout_stack).items[(long)iVar4 + -1].next.h;
    if (iVar13 == 2) {
      (ctx->last_rect).x = iVar17;
      (ctx->last_rect).y = iVar18;
      (ctx->last_rect).w = iVar15;
      (ctx->last_rect).h = iVar16;
      return;
    }
  }
  iVar13 = pmVar6->spacing;
  pmVar9 = &(ctx->layout_stack).items[(long)iVar4 + -1].position;
  pmVar9->x = pmVar9->x + iVar13 + iVar15;
  iVar11 = (ctx->layout_stack).items[(long)iVar4 + -1].next_row;
  iVar13 = iVar18 + iVar16 + iVar13;
  if (iVar13 < iVar11) {
    iVar13 = iVar11;
  }
  (ctx->layout_stack).items[(long)iVar4 + -1].next_row = iVar13;
  iVar17 = iVar17 + *piVar10;
  iVar18 = iVar18 + *(int *)((long)&ctx->id_stack + (long)iVar4 * 0x8c);
  iVar13 = iVar17 + iVar15;
  iVar11 = (ctx->layout_stack).items[(long)iVar4 + -1].max.x;
  iVar5 = (ctx->layout_stack).items[(long)iVar4 + -1].max.y;
  if (iVar13 < iVar11) {
    iVar13 = iVar11;
  }
  iVar11 = iVar18 + iVar16;
  if (iVar11 < iVar5) {
    iVar11 = iVar5;
  }
  (ctx->layout_stack).items[(long)iVar4 + -1].max.x = iVar13;
  (ctx->layout_stack).items[(long)iVar4 + -1].max.y = iVar11;
  (ctx->last_rect).x = iVar17;
  (ctx->last_rect).y = iVar18;
  (ctx->last_rect).w = iVar15;
  (ctx->last_rect).h = iVar16;
  return;
}

Assistant:

static void push_layout(mu_Context *ctx, mu_Rect body, mu_Vec2 scroll) {
  mu_Layout layout;
  int width = 0;
  memset(&layout, 0, sizeof(layout));
  layout.body = mu_rect(body.x - scroll.x, body.y - scroll.y, body.w, body.h);
  layout.max = mu_vec2(-0x1000000, -0x1000000);
  push(ctx->layout_stack, layout);
  mu_layout_row(ctx, 1, &width, 0);
}